

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O2

void __thiscall
deqp::gls::StateChangePerformanceCase::requireCoordBuffers
          (StateChangePerformanceCase *this,int count)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  uint uVar4;
  uint uVar5;
  GLuint buffer;
  int local_5c;
  vector<float,_std::allocator<float>_> coords;
  long lVar3;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if ((int)((ulong)((long)(this->m_coordBuffers).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->m_coordBuffers).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2) < count) {
    local_5c = count;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&this->m_coordBuffers,(long)count);
    coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    uVar5 = this->m_triangleCount;
    std::vector<float,_std::allocator<float>_>::reserve(&coords,(long)(int)(uVar5 * 6));
    uVar4 = 0;
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    for (; iVar1 = local_5c, uVar5 != uVar4; uVar4 = uVar4 + 1) {
      if ((uVar4 & 1) == 0) {
        buffer = 0xbf800000;
        std::vector<float,_std::allocator<float>_>::emplace_back<float>(&coords,(float *)&buffer);
        buffer = 0xbf800000;
        std::vector<float,_std::allocator<float>_>::emplace_back<float>(&coords,(float *)&buffer);
        buffer = 0x3f800000;
        std::vector<float,_std::allocator<float>_>::emplace_back<float>(&coords,(float *)&buffer);
        buffer = 0xbf800000;
        std::vector<float,_std::allocator<float>_>::emplace_back<float>(&coords,(float *)&buffer);
        buffer = 0x3f800000;
        std::vector<float,_std::allocator<float>_>::emplace_back<float>(&coords,(float *)&buffer);
        buffer = 0x3f800000;
        std::vector<float,_std::allocator<float>_>::emplace_back<float>(&coords,(float *)&buffer);
      }
      else {
        buffer = 0xbf800000;
        std::vector<float,_std::allocator<float>_>::emplace_back<float>(&coords,(float *)&buffer);
        buffer = 0xbf800000;
        std::vector<float,_std::allocator<float>_>::emplace_back<float>(&coords,(float *)&buffer);
        buffer = 0xbf800000;
        std::vector<float,_std::allocator<float>_>::emplace_back<float>(&coords,(float *)&buffer);
        buffer = 0x3f800000;
        std::vector<float,_std::allocator<float>_>::emplace_back<float>(&coords,(float *)&buffer);
        buffer = 0x3f800000;
        std::vector<float,_std::allocator<float>_>::emplace_back<float>(&coords,(float *)&buffer);
        buffer = 0x3f800000;
        std::vector<float,_std::allocator<float>_>::emplace_back<float>(&coords,(float *)&buffer);
      }
    }
    while ((int)((ulong)((long)(this->m_coordBuffers).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_coordBuffers).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2) < iVar1) {
      (**(code **)(lVar3 + 0x6c8))(1,&buffer);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"glGenBuffers()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x117);
      (**(code **)(lVar3 + 0x40))(0x8892,buffer);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"glBindBuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x11a);
      (**(code **)(lVar3 + 0x150))
                (0x8892,(long)coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                 coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,0x88e4);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"glBufferData()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x11c);
      (**(code **)(lVar3 + 0x40))(0x8892,0);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"glBindBuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x11e);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_coordBuffers,&buffer);
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&coords.super__Vector_base<float,_std::allocator<float>_>);
  }
  return;
}

Assistant:

void StateChangePerformanceCase::requireCoordBuffers (int count)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	if ((int)m_coordBuffers.size() >= count)
		return;

	m_coordBuffers.reserve(count);

	vector<GLfloat> coords;
	genCoords(coords, m_triangleCount);

	while ((int)m_coordBuffers.size() < count)
	{
		GLuint buffer;

		gl.genBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers()");

		gl.bindBuffer(GL_ARRAY_BUFFER, buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");
		gl.bufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(GLfloat)), &(coords[0]), GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData()");
		gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");

		m_coordBuffers.push_back(buffer);
	}
}